

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

bool tinygltf::detail::
     ForEachInArray<tinygltf::TinyGLTF::LoadFromString(tinygltf::Model*,std::__cxx11::string*,std::__cxx11::string*,char_const*,unsigned_int,std::__cxx11::string_const&,unsigned_int)::__12>
               (json *_v,char *member,anon_class_24_3_07ed8cb9 *cb)

{
  primitive_iterator_t this;
  bool bVar1;
  json *pjVar2;
  reference o;
  undefined1 local_90 [8];
  json_const_array_iterator end;
  json_const_array_iterator it;
  json *root;
  json_const_iterator itm;
  anon_class_24_3_07ed8cb9 *cb_local;
  char *member_local;
  json *_v_local;
  
  itm.m_it.primitive_iterator.m_it = (difference_type)cb;
  nlohmann::detail::
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::iter_impl((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               *)&root);
  bVar1 = FindMember(_v,member,(json_const_iterator *)&root);
  if (bVar1) {
    pjVar2 = GetValue((json_const_iterator *)&root);
    bVar1 = IsArray(pjVar2);
    if (bVar1) {
      pjVar2 = GetValue((json_const_iterator *)&root);
      ArrayBegin((json_const_array_iterator *)&end.m_it.primitive_iterator,pjVar2);
      ArrayEnd((json_const_array_iterator *)local_90,pjVar2);
      while (bVar1 = nlohmann::detail::
                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::
                     operator!=<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                               ((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)&end.m_it.primitive_iterator,
                                (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)local_90), this = itm.m_it.primitive_iterator, bVar1) {
        o = nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&end.m_it.primitive_iterator);
        bVar1 = TinyGLTF::LoadFromString::anon_class_24_3_07ed8cb9::operator()
                          ((anon_class_24_3_07ed8cb9 *)this.m_it,o);
        if (!bVar1) {
          return false;
        }
        nlohmann::detail::
        iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator++((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)&end.m_it.primitive_iterator);
      }
    }
  }
  return true;
}

Assistant:

bool ForEachInArray(const detail::json &_v, const char *member, Callback &&cb) {
  detail::json_const_iterator itm;
  if (detail::FindMember(_v, member, itm) &&
      detail::IsArray(detail::GetValue(itm))) {
    const detail::json &root = detail::GetValue(itm);
    auto it = detail::ArrayBegin(root);
    auto end = detail::ArrayEnd(root);
    for (; it != end; ++it) {
      if (!cb(*it)) return false;
    }
  }
  return true;
}